

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O1

void setpaid(monst *shkp)

{
  obj *obj;
  bill_x *pbVar1;
  monst *pmVar2;
  monst *pmVar3;
  
  clear_unpaid(shkp,invent);
  clear_unpaid(shkp,level->objlist);
  clear_unpaid(shkp,level->buriedobjlist);
  if ((thrownobj != (obj *)0x0) && (pbVar1 = onbill(thrownobj,shkp,'\x01'), pbVar1 != (bill_x *)0x0)
     ) {
    *(uint *)&thrownobj->field_0x4a = *(uint *)&thrownobj->field_0x4a & 0xfffffffb;
  }
  for (pmVar2 = level->monlist; pmVar3 = migrating_mons, pmVar2 != (monst *)0x0;
      pmVar2 = pmVar2->nmon) {
    clear_unpaid(shkp,pmVar2->minvent);
  }
  for (; pmVar3 != (monst *)0x0; pmVar3 = pmVar3->nmon) {
    clear_unpaid(shkp,pmVar3->minvent);
  }
  while (obj = level->billobjs, obj != (obj *)0x0) {
    obj_extract_self(obj);
    dealloc_obj(obj);
  }
  *(undefined2 *)((long)&shkp[0x1b].misc_worn_check + 2) = 0;
  *(undefined8 *)&shkp[0x1b].mappearance = 0;
  shkp[0x1b].mfleetim = '\0';
  shkp[0x1b].wormno = '\0';
  shkp[0x1b].weapon_check = '\0';
  shkp[0x1b].field_0x67 = 0;
  return;
}

Assistant:

static void setpaid(struct monst *shkp)
{
	struct obj *obj;
	struct monst *mtmp;

	clear_unpaid(shkp, invent);
	clear_unpaid(shkp, level->objlist);
	clear_unpaid(shkp, level->buriedobjlist);
	if (thrownobj && onbill(thrownobj, shkp, TRUE))
		thrownobj->unpaid = 0;
	for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon)
		clear_unpaid(shkp, mtmp->minvent);
	for (mtmp = migrating_mons; mtmp; mtmp = mtmp->nmon)
		clear_unpaid(shkp, mtmp->minvent);

	while ((obj = level->billobjs) != 0) {
		obj_extract_self(obj);
		dealloc_obj(obj);
	}
	ESHK(shkp)->billct = 0;
	ESHK(shkp)->credit = 0L;
	ESHK(shkp)->debit = 0L;
	ESHK(shkp)->loan = 0L;
}